

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void phi_values(int *n_data,int *n,int *c)

{
  if (*n_data < 0) {
    *n_data = 0;
  }
  if ((long)*n_data < 0x14) {
    *n = *(int *)(&DAT_00229850 + (long)*n_data * 4);
    *c = *(int *)(&DAT_00229800 + (long)*n_data * 4);
    *n_data = *n_data + 1;
  }
  else {
    *n_data = 0;
    *n = 0;
    *c = 0;
  }
  return;
}

Assistant:

void phi_values ( int *n_data, int *n, int *c )

//****************************************************************************80
//
//  Purpose:
//
//    PHI_VALUES returns some values of the PHI function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the argument of the PHI function.
//
//    Output, int *C, the value of the PHI function.
//
{
# define N_MAX 20

  int c_vec[N_MAX] = {
      1,   1,   2,   2,   4,   2,   6,   4,   6,   4, 
      8,   8,  16,  20,  16,  40, 148, 200, 200, 648 };
  int n_vec[N_MAX] = {
      1,   2,   3,   4,   5,   6,   7,   8,   9,  10, 
     20,  30,  40,  50,  60, 100, 149, 500, 750, 999 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *c = 0;
  }
  else
  {
    *n = n_vec[*n_data];
    *c = c_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}